

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O1

Table * __thiscall
Heuristics::popFromFrontierBestFirst(Table *__return_storage_ptr__,Heuristics *this)

{
  pointer *ppTVar1;
  int iVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  pointer pTVar8;
  ulong in_R8;
  int iVar9;
  
  __return_storage_ptr__->current_row = 1;
  __return_storage_ptr__->current_col = 1;
  __return_storage_ptr__->table[0][0] = '1';
  __return_storage_ptr__->table[0][1] = '3';
  __return_storage_ptr__->table[0][2] = '6';
  __return_storage_ptr__->table[1][0] = '4';
  __return_storage_ptr__->table[1][1] = ' ';
  __return_storage_ptr__->table[1][2] = '2';
  __return_storage_ptr__->table[2][0] = '7';
  __return_storage_ptr__->table[2][1] = '5';
  __return_storage_ptr__->table[2][2].number = '8';
  pTVar3 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  if (pTVar3 != pTVar4) {
    iVar7 = __return_storage_ptr__->evaluationScore;
    iVar9 = 1000;
    pTVar8 = pTVar3;
    do {
      iVar2 = pTVar8->evaluationScore;
      if (iVar2 <= iVar9) {
        __return_storage_ptr__->current_col = pTVar8->current_col;
        uVar5 = *(undefined8 *)(pTVar8->table[2] + 2);
        *(undefined8 *)__return_storage_ptr__->table = *(undefined8 *)pTVar8->table;
        *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = uVar5;
        in_R8 = uVar6;
        iVar7 = iVar2;
        iVar9 = iVar2;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != pTVar4);
    __return_storage_ptr__->evaluationScore = iVar7;
    uVar6 = (ulong)(int)in_R8;
  }
  pTVar8 = pTVar3 + uVar6 + 1;
  if (pTVar8 != pTVar4) {
    memmove(pTVar3 + uVar6,pTVar8,(long)pTVar4 - (long)pTVar8);
  }
  ppTVar1 = &(this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppTVar1 = *ppTVar1 + -1;
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierBestFirst() {
    Table bestNextState;
    int score = 1000;
    int positionOfBest;
    int position = 0;
    for (Table table : evaluatedChildren) {
        if (table.evaluationScore <= score) {
            score = table.evaluationScore;
            positionOfBest = position;
            bestNextState = table;
        }
        position++;
    }
    evaluatedChildren.erase(evaluatedChildren.begin()+positionOfBest);
    return bestNextState;
}